

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,string *_name,string *_className,string *_description,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_tags,SourceLineInfo *_lineInfo)

{
  _Rb_tree_header *p_Var1;
  SpecialProperties SVar2;
  SpecialProperties SVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  string lcaseTag;
  ostringstream oss;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->className,(string *)_className);
  std::__cxx11::string::string((string *)&this->description,(string *)_description);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->tags)._M_t,&_tags->_M_t);
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->lcaseTags)._M_t._M_impl.super__Rb_tree_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tagsAsString)._M_dataplus._M_p = (pointer)&(this->tagsAsString).field_2;
  (this->tagsAsString)._M_string_length = 0;
  (this->tagsAsString).field_2._M_local_buf[0] = '\0';
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  this->properties = None;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (p_Var5 = (_tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(_tags->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::operator<<((ostream *)local_1a8,"[");
    poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 1));
    std::operator<<(poVar4,"]");
    toLower(&local_1c8,(string *)(p_Var5 + 1));
    SVar2 = this->properties;
    SVar3 = parseSpecialTag(&local_1c8);
    this->properties = SVar3 | SVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->lcaseTags,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->tagsAsString,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( std::string const& _name,
                                std::string const& _className,
                                std::string const& _description,
                                std::set<std::string> const& _tags,
                                SourceLineInfo const& _lineInfo )
    :   name( _name ),
        className( _className ),
        description( _description ),
        tags( _tags ),
        lineInfo( _lineInfo ),
        properties( None )
    {
        std::ostringstream oss;
        for( std::set<std::string>::const_iterator it = _tags.begin(), itEnd = _tags.end(); it != itEnd; ++it ) {
            oss << "[" << *it << "]";
            std::string lcaseTag = toLower( *it );
            properties = static_cast<SpecialProperties>( properties | parseSpecialTag( lcaseTag ) );
            lcaseTags.insert( lcaseTag );
        }
        tagsAsString = oss.str();
    }